

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O1

int __thiscall bdQueryManager::QuerySummary(bdQueryManager *this,bdNodeId *id,bdQuerySummary *query)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *puVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)&this->mLocalQueries;
  do {
    p_Var5 = (((_List_base<bdQuery_*,_std::allocator<bdQuery_*>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&this->mLocalQueries) {
      return 0;
    }
    iVar3 = operator==((bdNodeId *)p_Var5[1]._M_next,id);
  } while (iVar3 == 0);
  puVar4 = &(p_Var5[1]._M_next)->_M_next;
  *(undefined4 *)((query->mId).data + 0x10) = *(undefined4 *)(puVar4 + 2);
  uVar2 = puVar4[1];
  *(undefined8 *)(query->mId).data = *puVar4;
  *(undefined8 *)((query->mId).data + 8) = uVar2;
  lVar1 = (long)p_Var5[1]._M_next;
  *(undefined4 *)((query->mLimit).super_bdNodeId.data + 0x10) = *(undefined4 *)(lVar1 + 0x24);
  uVar2 = *(undefined8 *)(lVar1 + 0x1c);
  *(undefined8 *)(query->mLimit).super_bdNodeId.data = *(undefined8 *)(lVar1 + 0x14);
  *(undefined8 *)((query->mLimit).super_bdNodeId.data + 8) = uVar2;
  lVar1 = (long)p_Var5[1]._M_next;
  query->mState = *(uint32_t *)(lVar1 + 0x28);
  query->mQueryTS = *(time_t *)(lVar1 + 0x30);
  query->mQueryFlags = *(uint32_t *)(lVar1 + 0x38);
  query->mSearchTime = *(int32_t *)(lVar1 + 0x3c);
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mClosest)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)(lVar1 + 0x48));
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mPotentialPeers)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)((long)p_Var5[1]._M_next + 0x78));
  puVar4 = (undefined8 *)((long)p_Var5[1]._M_next + 0xb8);
  if (&query->mProxiesUnknown != (list<bdPeer,_std::allocator<bdPeer>_> *)puVar4) {
    std::__cxx11::list<bdPeer,std::allocator<bdPeer>>::
    _M_assign_dispatch<std::_List_const_iterator<bdPeer>>
              ((list<bdPeer,std::allocator<bdPeer>> *)&query->mProxiesUnknown,*puVar4);
  }
  puVar4 = (undefined8 *)((long)p_Var5[1]._M_next + 0xd0);
  if (&query->mProxiesFlagged != (list<bdPeer,_std::allocator<bdPeer>_> *)puVar4) {
    std::__cxx11::list<bdPeer,std::allocator<bdPeer>>::
    _M_assign_dispatch<std::_List_const_iterator<bdPeer>>
              ((list<bdPeer,std::allocator<bdPeer>> *)&query->mProxiesFlagged,*puVar4);
  }
  query->mQueryIdlePeerRetryPeriod = *(int32_t *)((long)p_Var5[1]._M_next + 0x40);
  return 1;
}

Assistant:

int bdQueryManager::QuerySummary(const bdNodeId *id, bdQuerySummary &query) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		if ((*it)->mId == *id) {
			query.mId = (*it)->mId;
			query.mLimit = (*it)->mLimit;
			query.mState = (*it)->mState;
			query.mQueryTS = (*it)->mQueryTS;
			query.mQueryFlags = (*it)->mQueryFlags;
			query.mSearchTime = (*it)->mSearchTime;
			query.mClosest = (*it)->mClosest;
			query.mPotentialPeers = (*it)->mPotentialPeers;
			query.mProxiesUnknown = (*it)->mProxiesUnknown;
			query.mProxiesFlagged = (*it)->mProxiesFlagged;
 			query.mQueryIdlePeerRetryPeriod = (*it)->mQueryIdlePeerRetryPeriod;

			return 1;
		}
	}
	return 0;
}